

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

void update_theme(natwm_state *state,client *client,uint16_t previous_border_width)

{
  ushort uVar1;
  ushort uVar2;
  client_state cVar3;
  theme *ptVar4;
  workspace *workspace;
  monitor *monitor;
  xcb_rectangle_t xVar5;
  color_theme *pcVar6;
  border_theme *pbVar7;
  char *fmt;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined8 in_R8;
  int iVar11;
  undefined8 in_R9;
  uint16_t uVar12;
  uint32_t client_values [3];
  
  if (client->is_fullscreen == false) {
    ptVar4 = state->workspace_list->theme;
    cVar3 = client->state;
    if ((cVar3 & CLIENT_URGENT) == 0) {
      if ((cVar3 & CLIENT_STICKY) == 0) {
        if ((cVar3 & CLIENT_OFF_SCREEN) == 0) {
          pbVar7 = (border_theme *)
                   ((long)&ptVar4->border_width->unfocused + (ulong)((uint)client->is_focused * 2));
        }
        else {
          pbVar7 = ptVar4->border_width;
        }
      }
      else {
        pbVar7 = (border_theme *)&ptVar4->border_width->sticky;
      }
      uVar12 = pbVar7->unfocused;
      if ((cVar3 & CLIENT_STICKY) == 0) {
        if ((cVar3 & CLIENT_OFF_SCREEN) == 0) {
          pcVar6 = (color_theme *)(&ptVar4->color->unfocused + client->is_focused);
        }
        else {
          pcVar6 = ptVar4->color;
        }
      }
      else {
        pcVar6 = (color_theme *)&ptVar4->color->sticky;
      }
    }
    else {
      uVar12 = ptVar4->border_width->urgent;
      pcVar6 = (color_theme *)&ptVar4->color->urgent;
    }
    xcb_change_window_attributes
              (state->xcb,client->window,8,&pcVar6->unfocused->color_value,in_R8,in_R9,0x105cce);
    if ((client->state & CLIENT_UNTHEMED) != 0) {
      client->state = client->state & 0xef;
    }
    if (uVar12 != previous_border_width) {
      workspace = workspace_list_find_client_workspace(state->workspace_list,client);
      if (workspace == (workspace *)0x0) {
        fmt = "Failed to find workspace during update_theme";
      }
      else {
        monitor = monitor_list_get_workspace_monitor(state->monitor_list,workspace);
        if (monitor != (monitor *)0x0) {
          xVar5 = monitor_get_offset_rect(monitor);
          uVar1 = (client->rect).width;
          iVar11 = (uint)uVar1 + (uint)uVar12 * 2 + (int)(client->rect).x;
          iVar10 = (uint)(monitor->offsets).left + (xVar5._4_4_ & 0xffff);
          uVar2 = (client->rect).height;
          iVar9 = (uint)uVar2 + (uint)uVar12 * 2 + (int)(client->rect).y;
          iVar8 = (uint)(monitor->offsets).top + (uint)xVar5.height;
          if (iVar10 < iVar11) {
            (client->rect).width = ((short)iVar10 - (short)iVar11) + uVar1;
          }
          if (iVar8 < iVar9) {
            (client->rect).height = uVar2 + ((short)iVar8 - (short)iVar9);
          }
          xcb_configure_window(state->xcb,client->window,0x1c);
          client_update_hints(state,client,FRAME_EXTENTS);
          return;
        }
        fmt = "Failed to find monitor during update_theme";
      }
      internal_logger(natwm_logger,LEVEL_WARNING,fmt);
      return;
    }
  }
  return;
}

Assistant:

static void update_theme(const struct natwm_state *state, struct client *client,
                         uint16_t previous_border_width)
{
        if (client->is_fullscreen) {
                // No need to upate theme if client is fullscreen
                return;
        }

        uint16_t current_border_width
                = client_get_active_border_width(state->workspace_list->theme, client);
        const struct color_value *border_color
                = client_get_active_border_color(state->workspace_list->theme, client);

        xcb_change_window_attributes(
                state->xcb, client->window, XCB_CW_BORDER_PIXEL, &border_color->color_value);

        // If this is the first time the client has been themed, we need to
        // update the clients state to remove UNTHEMED
        if (client->state & CLIENT_UNTHEMED) {
                client->state &= (uint8_t)~CLIENT_UNTHEMED;
        }

        if (previous_border_width == current_border_width) {
                return;
        }

        struct workspace *workspace
                = workspace_list_find_client_workspace(state->workspace_list, client);

        if (workspace == NULL) {
                LOG_WARNING(natwm_logger, "Failed to find workspace during update_theme");

                return;
        }

        struct monitor *monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, workspace);

        if (monitor == NULL) {
                LOG_WARNING(natwm_logger, "Failed to find monitor during update_theme");

                return;
        }

        xcb_rectangle_t monitor_rect = monitor_get_offset_rect(monitor);

        int32_t total_border = (current_border_width * 2);

        int32_t total_client_width = (client->rect.width + client->rect.x + total_border);
        int32_t total_monitor_width = (monitor_rect.width + monitor->offsets.left);

        int32_t total_client_height = (client->rect.height + client->rect.y + total_border);
        int32_t total_monitor_height = (monitor_rect.height + monitor->offsets.top);

        // Check if either the width or the height will not be able to fit on
        // the monitor. If either doesn't correct the width to fit
        if (total_client_width > total_monitor_width) {
                int32_t diff = total_client_width - total_monitor_width;

                client->rect.width = (uint16_t)(client->rect.width - diff);
        }

        if (total_client_height > total_monitor_height) {
                int32_t diff = total_client_height - total_monitor_height;

                client->rect.height = (uint16_t)(client->rect.height - diff);
        }

        // Update the client
        uint16_t client_mask = XCB_CONFIG_WINDOW_WIDTH | XCB_CONFIG_WINDOW_HEIGHT
                | XCB_CONFIG_WINDOW_BORDER_WIDTH;
        uint32_t client_values[] = {
                client->rect.width,
                client->rect.height,
                current_border_width,
        };

        xcb_configure_window(state->xcb, client->window, client_mask, client_values);

        client_update_hints(state, client, FRAME_EXTENTS);
}